

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

node * list_insert_node_after(list *list,node *existing,node *new)

{
  list *plVar1;
  
  if (new == (node *)0x0 || (existing == (node *)0x0 || list == (list *)0x0)) {
    new = (node *)0x0;
  }
  else {
    new->previous = existing;
    plVar1 = list;
    if (existing->next != (node *)0x0) {
      new->next = existing->next;
      plVar1 = (list *)existing->next;
    }
    plVar1->tail = new;
    existing->next = new;
    list->size = list->size + 1;
  }
  return new;
}

Assistant:

struct node *list_insert_node_after(struct list *list, struct node *existing, struct node *new)
{
        if (list == NULL || existing == NULL || new == NULL) {
                return NULL;
        }

        new->previous = existing;

        if (existing->next == NULL) {
                list->tail = new;
        } else {
                new->next = existing->next;
                existing->next->previous = new;
        }

        existing->next = new;

        ++list->size;

        return new;
}